

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall
ByteCodeGenerator::LoadThisObject
          (ByteCodeGenerator *this,FuncInfo *funcInfo,bool thisLoadedFromParams)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  RegSlot RVar6;
  undefined4 *puVar7;
  RegSlot lhsLocation;
  
  pSVar1 = funcInfo->thisSymbol;
  if (pSVar1 == (Symbol *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x879,"(thisSym)","thisSym");
    if (!bVar4) goto LAB_0075e69e;
    *puVar7 = 0;
  }
  BVar5 = FuncInfo::IsLambda(funcInfo);
  if (BVar5 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x87a,"(!funcInfo->IsLambda())","!funcInfo->IsLambda()");
    if (!bVar4) goto LAB_0075e69e;
    *puVar7 = 0;
  }
  BVar5 = FuncInfo::IsClassConstructor(funcInfo);
  if (BVar5 != 0) {
    BVar5 = FuncInfo::IsBaseClassConstructor(funcInfo);
    if (BVar5 == 0) {
      Js::ByteCodeWriter::Reg1(&this->m_writer,InitUndecl,pSVar1->location);
      return;
    }
    pSVar2 = funcInfo->newTargetSymbol;
    if (pSVar2 == (Symbol *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x885,"(newTargetSym)","newTargetSym");
      if (!bVar4) {
LAB_0075e69e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    Js::ByteCodeWriter::Reg2
              (&this->m_writer,NewScObjectNoCtorFull,pSVar1->location,pSVar2->location);
    return;
  }
  bVar4 = FuncInfo::IsGlobalFunction(funcInfo);
  if (bVar4) {
    bVar4 = FuncInfo::IsGlobalFunction(funcInfo);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x8a6,"(funcInfo->IsGlobalFunction())","funcInfo->IsGlobalFunction()");
      if (!bVar4) goto LAB_0075e69e;
      *puVar7 = 0;
    }
    RVar6 = funcInfo->nullConstantRegister;
    lhsLocation = pSVar1->location;
  }
  else {
    if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) != 0) {
      Js::ByteCodeWriter::ArgIn0(&this->m_writer,pSVar1->location);
      return;
    }
    if (!thisLoadedFromParams) {
      RVar6 = FuncInfo::AcquireTmpRegister(funcInfo);
      Js::ByteCodeWriter::ArgIn0(&this->m_writer,RVar6);
      EmitThis(this,funcInfo,pSVar1->location,RVar6);
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar6);
      return;
    }
    RVar6 = pSVar1->location;
    lhsLocation = RVar6;
  }
  EmitThis(this,funcInfo,lhsLocation,RVar6);
  return;
}

Assistant:

void ByteCodeGenerator::LoadThisObject(FuncInfo *funcInfo, bool thisLoadedFromParams)
{
    Symbol* thisSym = funcInfo->GetThisSymbol();
    Assert(thisSym);
    Assert(!funcInfo->IsLambda());

    if (funcInfo->IsClassConstructor())
    {
        // Derived class constructors initialize 'this' to be Undecl
        //   - we'll check this value during a super call and during 'this' access
        //
        // Base class constructors initialize 'this' to a new object using new.target
        if (funcInfo->IsBaseClassConstructor())
        {
            Symbol* newTargetSym = funcInfo->GetNewTargetSymbol();
            Assert(newTargetSym);

            this->Writer()->Reg2(Js::OpCode::NewScObjectNoCtorFull, thisSym->GetLocation(), newTargetSym->GetLocation());
        }
        else
        {
            this->m_writer.Reg1(Js::OpCode::InitUndecl, thisSym->GetLocation());
        }
    }
    else if (!funcInfo->IsGlobalFunction())
    {
        //
        // thisLoadedFromParams would be true for the event Handler case,
        // "this" would have been loaded from parameters to put in the environment
        //
        if (funcInfo->GetIsStrictMode())
        {
            m_writer.ArgIn0(thisSym->GetLocation());
        }
        else if (!thisLoadedFromParams)
        {
            Js::RegSlot tmpReg = funcInfo->AcquireTmpRegister();
            m_writer.ArgIn0(tmpReg);
            EmitThis(funcInfo, thisSym->GetLocation(), tmpReg);
            funcInfo->ReleaseTmpRegister(tmpReg);
        }
        else
        {
            EmitThis(funcInfo, thisSym->GetLocation(), thisSym->GetLocation());
        }
    }
    else
    {
        Assert(funcInfo->IsGlobalFunction());
        Js::RegSlot root = funcInfo->nullConstantRegister;
        EmitThis(funcInfo, thisSym->GetLocation(), root);
    }
}